

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.cpp
# Opt level: O3

void __thiscall Float_Zeros_Test::~Float_Zeros_Test(Float_Zeros_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Float, Zeros) {
    test_parsing("0.0", 0.0);
    test_parsing("+0.0", 0.0);
    test_parsing("-0.0", 0.0);

    test_parsing("0e0", 0.0);
    test_parsing("-0e0", 0.0);
    test_parsing("0e-0", 0.0);
    test_parsing("0e+0", 0.0);
    test_parsing("-0e-0", 0.0);
    test_parsing("-0e+0", 0.0);
    test_parsing("+0e-0", 0.0);
    test_parsing("+0e+0", 0.0);
    test_parsing("0e10", 0.0);
    test_parsing("0e-10", 0.0);

    test_parsing("0.0e0", 0.0);
    test_parsing("0.000e+0", 0.0);
    test_parsing("0.00e-0", 0.0);
    test_parsing("-0.00e+0", 0.0);
    test_parsing("+0.00e-100", 0.0);
}